

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::SPFMethod::doRNEMDImpl
          (SPFMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  uint *puVar1;
  Molecule *this_00;
  Snapshot *pSVar2;
  SelectionManager *pSVar3;
  StuntDouble *pSVar4;
  SelectionManager *this_01;
  double dVar5;
  RealType RVar6;
  int selej;
  int selei;
  RealType b;
  Vector3d vel;
  RealType a;
  Vector3d angMom;
  Vector3d v_b;
  Vector3d v_a;
  int local_10c;
  SelectionManager *local_108;
  int local_fc;
  SPFMethod *local_f8;
  SelectionManager *local_f0;
  RealType local_e8;
  Vector<double,_3U> local_e0;
  RealType local_c8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  if ((this->super_RNEMD).doRNEMD_ == true) {
    local_108 = smanB;
    if (this->forceManager_->hasSelectedMolecule_ == false) {
      selectMolecule(this);
    }
    pSVar3 = local_108;
    this_01 = local_108;
    if (0.0 < this->spfTarget_) {
      this_01 = smanA;
    }
    SelectionManager::operator-=(this_01,&this->selectedMoleculeMan_);
    SelectionManager::operator=(&this->smanA_,smanA);
    SelectionManager::operator=(&this->smanB_,pSVar3);
    if (this->failedLastTrial_ == false) {
      Vector<double,_3U>::Vector(&local_48);
      Vector<double,_3U>::Vector(&local_60);
      local_c8 = 0.0;
      local_e8 = 0.0;
      local_f8 = this;
      isValidExchange(this,(Vector3d *)&local_48,(Vector3d *)&local_60,&local_c8,&local_e8);
      Vector<double,_3U>::Vector(&local_e0);
      local_fc = 0;
      local_10c = 0;
      local_f0 = smanA;
      pSVar4 = SelectionManager::beginSelected(smanA,&local_fc);
      RVar6 = local_c8;
      while (pSVar4 != (StuntDouble *)0x0) {
        StuntDouble::getVel((Vector3d *)&local_c0,pSVar4);
        operator-(&local_a8,&local_c0,&local_48);
        operator*(&local_90,&local_a8,RVar6);
        OpenMD::operator+(&local_78,&local_90,&local_48);
        Vector3<double>::operator=((Vector3<double> *)&local_e0,&local_78);
        StuntDouble::setVel(pSVar4,(Vector3d *)&local_e0);
        if (pSVar4->objType_ - otDAtom < 2) {
          StuntDouble::getJ((Vector3d *)&local_a8,pSVar4);
          operator*(&local_90,&local_a8,RVar6);
          Vector<double,_3U>::Vector(&local_78,&local_90);
          StuntDouble::setJ(pSVar4,(Vector3d *)&local_78);
        }
        pSVar4 = SelectionManager::nextSelected(local_f0,&local_fc);
      }
      pSVar4 = SelectionManager::beginSelected(local_108,&local_10c);
      RVar6 = local_e8;
      while (this = local_f8, pSVar4 != (StuntDouble *)0x0) {
        StuntDouble::getVel((Vector3d *)&local_c0,pSVar4);
        operator-(&local_a8,&local_c0,&local_60);
        operator*(&local_90,&local_a8,RVar6);
        OpenMD::operator+(&local_78,&local_90,&local_60);
        Vector3<double>::operator=((Vector3<double> *)&local_e0,&local_78);
        StuntDouble::setVel(pSVar4,(Vector3d *)&local_e0);
        if (pSVar4->objType_ - otDAtom < 2) {
          StuntDouble::getJ((Vector3d *)&local_a8,pSVar4);
          operator*(&local_90,&local_a8,RVar6);
          Vector<double,_3U>::Vector(&local_78,&local_90);
          StuntDouble::setJ(pSVar4,(Vector3d *)&local_78);
        }
        pSVar4 = SelectionManager::nextSelected(local_108,&local_10c);
      }
      if ((local_f8->super_RNEMD).useChargedSPF_ == true) {
        this_00 = local_f8->forceManager_->selectedMolecule_;
        if (this_00 == (Molecule *)0x0) {
          dVar5 = 0.0;
        }
        else {
          dVar5 = Molecule::getFixedCharge(this_00);
        }
        RVar6 = dVar5 * this->spfTarget_;
      }
      else {
        RVar6 = local_f8->spfTarget_;
      }
      (this->super_RNEMD).particleExchange_ = RVar6 + (this->super_RNEMD).particleExchange_;
      (this->super_RNEMD).kineticExchange_ =
           (this->super_RNEMD).kineticTarget_ + (this->super_RNEMD).kineticExchange_;
    }
    else {
      puVar1 = &(this->super_RNEMD).failTrialCount_;
      *puVar1 = *puVar1 + 1;
    }
    pSVar2 = (this->super_RNEMD).currentSnap_;
    pSVar2->hasTranslationalKineticEnergy = false;
    pSVar2->hasRotationalKineticEnergy = false;
    pSVar2->hasKineticEnergy = false;
  }
  return;
}

Assistant:

void SPFMethod::doRNEMDImpl(SelectionManager& smanA,
                              SelectionManager& smanB) {
    if (!doRNEMD_) return;

    if (!forceManager_->getHasSelectedMolecule()) { selectMolecule(); }

    // Remove selected molecule from the source selection manager
    if (spfTarget_ > 0.0) {
      smanA -= selectedMoleculeMan_;
    } else {
      smanB -= selectedMoleculeMan_;
    }

    smanA_ = smanA;
    smanB_ = smanB;

    if (!failedLastTrial_) {
      Vector3d v_a {};
      Vector3d v_b {};
      RealType a {0.0};
      RealType b {0.0};

      isValidExchange(v_a, v_b, a, b);

      Vector3d vel;

      int selei {}, selej {};
      StuntDouble* sd;

      for (sd = smanA.beginSelected(selei); sd != NULL;
           sd = smanA.nextSelected(selei)) {
        vel = (sd->getVel() - v_a) * a + v_a;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * a;
          sd->setJ(angMom);
        }
      }

      for (sd = smanB.beginSelected(selej); sd != NULL;
           sd = smanB.nextSelected(selej)) {
        vel = (sd->getVel() - v_b) * b + v_b;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * b;
          sd->setJ(angMom);
        }
      }

      if (useChargedSPF_) {
        RealType fixedChargeOnIon {};

        if (Molecule* selectedMolecule = forceManager_->getSelectedMolecule();
            selectedMolecule) {
          fixedChargeOnIon = selectedMolecule->getFixedCharge();
        }

#ifdef IS_MPI
        MPI_Bcast(&fixedChargeOnIon, 1, MPI_REALTYPE,
                  info_->getMolToProc(currentSnap_->getSPFData()->globalID),
                  MPI_COMM_WORLD);
#endif

        particleExchange_ += spfTarget_ * fixedChargeOnIon;
      } else {
        particleExchange_ += spfTarget_;
      }

      kineticExchange_ += kineticTarget_;
    } else {
      failTrialCount_++;
    }

    currentSnap_->hasTranslationalKineticEnergy = false;
    currentSnap_->hasRotationalKineticEnergy    = false;
    currentSnap_->hasKineticEnergy              = false;
  }